

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PendingTermsAdd(Fts3Table *p,int iLangid,char *zText,int iCol,u32 *pnWord)

{
  long in_RDX;
  long in_RDI;
  int *in_R8;
  bool bVar1;
  Fts3Index *pIndex;
  int i;
  _func_int_sqlite3_tokenizer_cursor_ptr_char_ptr_ptr_int_ptr_int_ptr_int_ptr_int_ptr *xNext;
  sqlite3_tokenizer_cursor *pCsr;
  sqlite3_tokenizer_module *pModule;
  sqlite3_tokenizer *pTokenizer;
  int nToken;
  char *zToken;
  int nWord;
  int iPos;
  int iEnd;
  int iStart;
  int rc;
  int local_90;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  _func_int_sqlite3_tokenizer_cursor_ptr_char_ptr_ptr_int_ptr_int_ptr_int_ptr_int_ptr *zToken_00;
  Fts3Hash *in_stack_ffffffffffffff90;
  sqlite3_module *psVar2;
  Fts3Table *p_00;
  int local_54;
  char *local_50;
  int local_44;
  int local_40 [4];
  int *local_30;
  long local_10;
  int local_4;
  
  local_40[2] = 0;
  local_40[1] = 0;
  local_40[0] = 0;
  local_44 = 0;
  local_54 = 0;
  p_00 = *(Fts3Table **)(in_RDI + 0x48);
  psVar2 = (p_00->base).pModule;
  if (in_RDX == 0) {
    *in_R8 = 0;
    local_4 = 0;
  }
  else {
    local_30 = in_R8;
    local_10 = in_RDI;
    local_40[3] = sqlite3Fts3OpenTokenizer
                            ((sqlite3_tokenizer *)p_00,(int)((ulong)psVar2 >> 0x20),
                             &in_stack_ffffffffffffff90->keyClass,
                             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                             (sqlite3_tokenizer_cursor **)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    local_4 = local_40[3];
    if (local_40[3] == 0) {
      zToken_00 = (_func_int_sqlite3_tokenizer_cursor_ptr_char_ptr_ptr_int_ptr_int_ptr_int_ptr_int_ptr
                   *)psVar2->xDestroy;
      while( true ) {
        bVar1 = false;
        if (local_40[3] == 0) {
          local_40[3] = (*zToken_00)((sqlite3_tokenizer_cursor *)in_stack_ffffffffffffff90,&local_50
                                     ,&local_54,local_40 + 2,local_40 + 1,local_40);
          bVar1 = local_40[3] == 0;
        }
        if (!bVar1) goto LAB_001c8e80;
        if (local_44 <= local_40[0]) {
          local_44 = local_40[0] + 1;
        }
        if (((local_40[0] < 0) || (local_50 == (char *)0x0)) || (local_54 < 1)) break;
        local_40[3] = fts3PendingTermsAddOne
                                (p_00,(int)((ulong)psVar2 >> 0x20),(int)psVar2,
                                 in_stack_ffffffffffffff90,(char *)zToken_00,
                                 in_stack_ffffffffffffff84);
        in_stack_ffffffffffffff84 = 1;
        while( true ) {
          bVar1 = false;
          if (local_40[3] == 0) {
            bVar1 = in_stack_ffffffffffffff84 < *(int *)(local_10 + 0x1d8);
          }
          if (!bVar1) break;
          if (*(int *)(*(long *)(local_10 + 0x1e0) + (long)in_stack_ffffffffffffff84 * 0x28) <=
              local_54) {
            local_40[3] = fts3PendingTermsAddOne
                                    (p_00,(int)((ulong)psVar2 >> 0x20),(int)psVar2,
                                     in_stack_ffffffffffffff90,(char *)zToken_00,
                                     in_stack_ffffffffffffff84);
          }
          in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1;
        }
      }
      local_40[3] = 1;
LAB_001c8e80:
      (*psVar2->xDisconnect)((sqlite3_tokenizer_cursor *)in_stack_ffffffffffffff90);
      *local_30 = local_44 + *local_30;
      if (local_40[3] == 0x65) {
        local_90 = 0;
      }
      else {
        local_90 = local_40[3];
      }
      local_4 = local_90;
    }
  }
  return local_4;
}

Assistant:

static int fts3PendingTermsAdd(
  Fts3Table *p,                   /* Table into which text will be inserted */
  int iLangid,                    /* Language id to use */
  const char *zText,              /* Text of document to be inserted */
  int iCol,                       /* Column into which text is being inserted */
  u32 *pnWord                     /* IN/OUT: Incr. by number tokens inserted */
){
  int rc;
  int iStart = 0;
  int iEnd = 0;
  int iPos = 0;
  int nWord = 0;

  char const *zToken;
  int nToken = 0;

  sqlite3_tokenizer *pTokenizer = p->pTokenizer;
  sqlite3_tokenizer_module const *pModule = pTokenizer->pModule;
  sqlite3_tokenizer_cursor *pCsr;
  int (*xNext)(sqlite3_tokenizer_cursor *pCursor,
      const char**,int*,int*,int*,int*);

  assert( pTokenizer && pModule );

  /* If the user has inserted a NULL value, this function may be called with
  ** zText==0. In this case, add zero token entries to the hash table and 
  ** return early. */
  if( zText==0 ){
    *pnWord = 0;
    return SQLITE_OK;
  }

  rc = sqlite3Fts3OpenTokenizer(pTokenizer, iLangid, zText, -1, &pCsr);
  if( rc!=SQLITE_OK ){
    return rc;
  }

  xNext = pModule->xNext;
  while( SQLITE_OK==rc
      && SQLITE_OK==(rc = xNext(pCsr, &zToken, &nToken, &iStart, &iEnd, &iPos))
  ){
    int i;
    if( iPos>=nWord ) nWord = iPos+1;

    /* Positions cannot be negative; we use -1 as a terminator internally.
    ** Tokens must have a non-zero length.
    */
    if( iPos<0 || !zToken || nToken<=0 ){
      rc = SQLITE_ERROR;
      break;
    }

    /* Add the term to the terms index */
    rc = fts3PendingTermsAddOne(
        p, iCol, iPos, &p->aIndex[0].hPending, zToken, nToken
    );
    
    /* Add the term to each of the prefix indexes that it is not too 
    ** short for. */
    for(i=1; rc==SQLITE_OK && i<p->nIndex; i++){
      struct Fts3Index *pIndex = &p->aIndex[i];
      if( nToken<pIndex->nPrefix ) continue;
      rc = fts3PendingTermsAddOne(
          p, iCol, iPos, &pIndex->hPending, zToken, pIndex->nPrefix
      );
    }
  }

  pModule->xClose(pCsr);
  *pnWord += nWord;
  return (rc==SQLITE_DONE ? SQLITE_OK : rc);
}